

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O0

int kwsysSystem__AppendByte(char *local,char **begin,char **end,int *size,char c)

{
  char *pcVar1;
  char *pcVar2;
  char *__dest;
  char *newBuffer;
  kwsysSystem_ptrdiff_t length;
  char c_local;
  int *size_local;
  char **end_local;
  char **begin_local;
  char *local_local;
  
  if ((long)*size <= (long)*end - (long)*begin) {
    pcVar1 = *end;
    pcVar2 = *begin;
    __dest = (char *)malloc((long)(*size << 1));
    if (__dest == (char *)0x0) {
      return 0;
    }
    memcpy(__dest,*begin,(long)pcVar1 - (long)pcVar2);
    if (*begin != local) {
      free(*begin);
    }
    *begin = __dest;
    *end = *begin + ((long)pcVar1 - (long)pcVar2);
    *size = *size << 1;
  }
  pcVar1 = *end;
  *end = pcVar1 + 1;
  *pcVar1 = c;
  return 1;
}

Assistant:

static int kwsysSystem__AppendByte(char* local,
                                   char** begin, char** end,
                                   int* size, char c)
{
  /* Allocate space for the character.  */
  if((*end - *begin) >= *size)
    {
    kwsysSystem_ptrdiff_t length = *end - *begin;
    char* newBuffer = (char*)malloc((size_t)(*size*2));
    if(!newBuffer)
      {
      return 0;
      }
    memcpy(newBuffer, *begin, (size_t)(length)*sizeof(char));
    if(*begin != local)
      {
      free(*begin);
      }
    *begin = newBuffer;
    *end = *begin + length;
    *size *= 2;
    }

  /* Store the character.  */
  *(*end)++ = c;
  return 1;
}